

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromSignExtendedInteger
          (IEEEFloat *this,integerPart *src,uint srcCount,bool isSigned,roundingMode rounding_mode)

{
  int iVar1;
  ulong uVar2;
  WordType *dst;
  integerPart *copy;
  opStatus status;
  roundingMode rounding_mode_local;
  bool isSigned_local;
  uint srcCount_local;
  integerPart *src_local;
  IEEEFloat *this_local;
  
  if ((isSigned) && (iVar1 = APInt::tcExtractBit(src,srcCount * 0x40 - 1), iVar1 != 0)) {
    this->field_0x12 = this->field_0x12 & 0xf7 | 8;
    uVar2 = SUB168(ZEXT416(srcCount) * ZEXT816(8),0);
    if (SUB168(ZEXT416(srcCount) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    dst = (WordType *)operator_new__(uVar2);
    APInt::tcAssign(dst,src,srcCount);
    APInt::tcNegate(dst,srcCount);
    copy._0_4_ = convertFromUnsignedParts(this,dst,srcCount,rounding_mode);
    if (dst != (WordType *)0x0) {
      operator_delete__(dst);
    }
  }
  else {
    this->field_0x12 = this->field_0x12 & 0xf7;
    copy._0_4_ = convertFromUnsignedParts(this,src,srcCount,rounding_mode);
  }
  return (opStatus)copy;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromSignExtendedInteger(const integerPart *src,
                                          unsigned int srcCount, bool isSigned,
                                          roundingMode rounding_mode) {
  opStatus status;

  if (isSigned &&
      APInt::tcExtractBit(src, srcCount * integerPartWidth - 1)) {
    integerPart *copy;

    /* If we're signed and negative negate a copy.  */
    sign = true;
    copy = new integerPart[srcCount];
    APInt::tcAssign(copy, src, srcCount);
    APInt::tcNegate(copy, srcCount);
    status = convertFromUnsignedParts(copy, srcCount, rounding_mode);
    delete [] copy;
  } else {
    sign = false;
    status = convertFromUnsignedParts(src, srcCount, rounding_mode);
  }

  return status;
}